

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

size_t FTypeTable::Hash(PClass *p1,intptr_t p2,intptr_t p3)

{
  uint uVar1;
  PType **ppPVar2;
  undefined4 local_58;
  undefined4 local_54;
  uint i_1;
  uint i;
  TArray<PType_*,_PType_*> *a3;
  TArray<PType_*,_PType_*> *a2;
  size_t i3;
  size_t i2;
  size_t i1;
  intptr_t p3_local;
  intptr_t p2_local;
  PClass *p1_local;
  
  i2 = (ulong)p1 >> 0x20 | (long)p1 << 0x20;
  if (p1 == PPrototype::RegistrationInfo.MyClass) {
    local_54 = 0;
    while( true ) {
      uVar1 = TArray<PType_*,_PType_*>::Size((TArray<PType_*,_PType_*> *)p2);
      if (uVar1 <= local_54) break;
      ppPVar2 = TArray<PType_*,_PType_*>::operator[]((TArray<PType_*,_PType_*> *)p2,(ulong)local_54)
      ;
      i2 = i2 * 0x39531fbf + (long)*ppPVar2;
      local_54 = local_54 + 1;
    }
    local_58 = 0;
    while( true ) {
      uVar1 = TArray<PType_*,_PType_*>::Size((TArray<PType_*,_PType_*> *)p3);
      if (uVar1 <= local_58) break;
      ppPVar2 = TArray<PType_*,_PType_*>::operator[]((TArray<PType_*,_PType_*> *)p3,(ulong)local_58)
      ;
      i2 = i2 * 0x39531fbf + (long)*ppPVar2;
      local_58 = local_58 + 1;
    }
    p1_local = (PClass *)i2;
  }
  else {
    p1_local = (PClass *)((i2 ^ 0xffffffffffffffff ^ p2) + p3 * 0x39531fbf);
  }
  return (size_t)p1_local;
}

Assistant:

size_t FTypeTable::Hash(const PClass *p1, intptr_t p2, intptr_t p3)
{
	size_t i1 = (size_t)p1;

	// Swap the high and low halves of i1. The compiler should be smart enough
	// to transform this into a ROR or ROL.
	i1 = (i1 >> (sizeof(size_t)*4)) | (i1 << (sizeof(size_t)*4));

	if (p1 != RUNTIME_CLASS(PPrototype))
	{
		size_t i2 = (size_t)p2;
		size_t i3 = (size_t)p3;
		return (~i1 ^ i2) + i3 * 961748927;	// i3 is multiplied by a prime
	}
	else
	{ // Prototypes need to hash the TArrays at p2 and p3
		const TArray<PType *> *a2 = (const TArray<PType *> *)p2;
		const TArray<PType *> *a3 = (const TArray<PType *> *)p3;
		for (unsigned i = 0; i < a2->Size(); ++i)
		{
			i1 = (i1 * 961748927) + (size_t)((*a2)[i]);
		}
		for (unsigned i = 0; i < a3->Size(); ++i)
		{
			i1 = (i1 * 961748927) + (size_t)((*a3)[i]);
		}
		return i1;
	}
}